

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread.c
# Opt level: O0

int evthread_set_lock_callbacks(evthread_lock_callbacks *cbs)

{
  evthread_lock_callbacks *__dest;
  evthread_lock_callbacks *target;
  evthread_lock_callbacks *cbs_local;
  
  __dest = evthread_get_lock_callbacks();
  if ((event_debug_mode_on_ != 0) && (event_debug_created_threadable_ctx_ != 0)) {
    event_errx(1,"evthread initialization must be called BEFORE anything else!");
  }
  if (cbs == (evthread_lock_callbacks *)0x0) {
    if (__dest->alloc != (_func_void_ptr_uint *)0x0) {
      event_warnx(
                 "Trying to disable lock functions after they have been set up will probaby not work."
                 );
    }
    memset(__dest,0,0x28);
    cbs_local._4_4_ = 0;
  }
  else if (__dest->alloc == (_func_void_ptr_uint *)0x0) {
    if ((((cbs->alloc == (_func_void_ptr_uint *)0x0) ||
         (cbs->free == (_func_void_void_ptr_uint *)0x0)) ||
        (cbs->lock == (_func_int_uint_void_ptr *)0x0)) ||
       (cbs->unlock == (_func_int_uint_void_ptr *)0x0)) {
      cbs_local._4_4_ = -1;
    }
    else {
      memcpy(__dest,cbs,0x28);
      cbs_local._4_4_ = event_global_setup_locks_(1);
    }
  }
  else if ((((__dest->lock_api_version == cbs->lock_api_version) &&
            (__dest->supported_locktypes == cbs->supported_locktypes)) &&
           ((__dest->alloc == cbs->alloc &&
            ((__dest->free == cbs->free && (__dest->lock == cbs->lock)))))) &&
          (__dest->unlock == cbs->unlock)) {
    cbs_local._4_4_ = 0;
  }
  else {
    event_warnx("Can\'t change lock callbacks once they have been initialized.");
    cbs_local._4_4_ = -1;
  }
  return cbs_local._4_4_;
}

Assistant:

int
evthread_set_lock_callbacks(const struct evthread_lock_callbacks *cbs)
{
	struct evthread_lock_callbacks *target = evthread_get_lock_callbacks();

#ifndef EVENT__DISABLE_DEBUG_MODE
	if (event_debug_mode_on_) {
		if (event_debug_created_threadable_ctx_) {
		    event_errx(1, "evthread initialization must be called BEFORE anything else!");
		}
	}
#endif

	if (!cbs) {
		if (target->alloc)
			event_warnx("Trying to disable lock functions after "
			    "they have been set up will probaby not work.");
		memset(target, 0, sizeof(evthread_lock_fns_));
		return 0;
	}
	if (target->alloc) {
		/* Uh oh; we already had locking callbacks set up.*/
		if (target->lock_api_version == cbs->lock_api_version &&
			target->supported_locktypes == cbs->supported_locktypes &&
			target->alloc == cbs->alloc &&
			target->free == cbs->free &&
			target->lock == cbs->lock &&
			target->unlock == cbs->unlock) {
			/* no change -- allow this. */
			return 0;
		}
		event_warnx("Can't change lock callbacks once they have been "
		    "initialized.");
		return -1;
	}
	if (cbs->alloc && cbs->free && cbs->lock && cbs->unlock) {
		memcpy(target, cbs, sizeof(evthread_lock_fns_));
		return event_global_setup_locks_(1);
	} else {
		return -1;
	}
}